

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O1

void __thiscall
TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
::AssembleNew(TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
              *this,TPZMatrix<std::complex<double>_> *stiffness,
             TPZFMatrix<std::complex<double>_> *rhs,TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  long lVar1;
  TPZReference *pTVar2;
  TPZCompEl *pTVar3;
  bool bVar4;
  int iVar5;
  int64_t size;
  TPZCompEl **ppTVar6;
  long lVar7;
  TPZFMatrix<std::complex<double>_> *rhs_00;
  long lVar8;
  long lVar9;
  TPZVec<int> elorder;
  TPZManVector<long,_10> sourceindex;
  TPZManVector<long,_10> destinationindex;
  TPZElementMatrixT<std::complex<double>_> ek;
  TPZElementMatrixT<std::complex<double>_> ef;
  int iStack_10514;
  TPZMatrix<std::complex<double>_> *pTStack_10510;
  TPZCompMesh *pTStack_10508;
  TPZFNMatrix<1000,_std::complex<double>_> *pTStack_10500;
  TPZFMatrix<std::complex<double>_> *pTStack_104f8;
  TPZFNMatrix<1000,_std::complex<double>_> *pTStack_104f0;
  TPZFMatrix<std::complex<double>_> *pTStack_104e8;
  TPZEquationFilter *pTStack_104e0;
  TPZFMatrix<std::complex<double>_> *pTStack_104d8;
  TPZVec<int> TStack_104d0;
  TPZManVector<long,_10> TStack_104b0;
  TPZManVector<long,_10> TStack_10440;
  TPZElementMatrixT<std::complex<double>_> TStack_103d0;
  TPZElementMatrixT<std::complex<double>_> local_8200;
  
  lVar1 = ((*(TPZCompMesh **)&this->field_0x8)->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.
          fNElements;
  pTStack_10510 = stiffness;
  pTStack_104d8 = rhs;
  TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT
            (&TStack_103d0,*(TPZCompMesh **)&this->field_0x8,EK);
  TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT
            (&local_8200,*(TPZCompMesh **)&this->field_0x8,EF);
  TPZManVector<long,_10>::TPZManVector(&TStack_10440,0);
  TPZManVector<long,_10>::TPZManVector(&TStack_104b0,0);
  pTStack_10508 = *(TPZCompMesh **)&this->field_0x8;
  size = TPZCompMesh::NEquations(pTStack_10508);
  iStack_10514 = 0;
  TPZVec<int>::TPZVec(&TStack_104d0,size,&iStack_10514);
  OrderElement(this);
  if (0 < lVar1) {
    pTStack_10508 = (TPZCompMesh *)&pTStack_10508->fElementVec;
    pTStack_104e0 = (TPZEquationFilter *)&this->field_0x48;
    pTStack_104f0 = &TStack_103d0.fConstrMat;
    pTStack_104e8 = &local_8200.fConstrMat.super_TPZFMatrix<std::complex<double>_>;
    pTStack_10500 = &TStack_103d0.fMat;
    pTStack_104f8 = &local_8200.fMat.super_TPZFMatrix<std::complex<double>_>;
    lVar8 = 0;
    lVar9 = 0;
    do {
      pTVar2 = guiInterface->fRef;
      if ((pTVar2 != (TPZReference *)0x0) && (pTVar2->fPointer != (TPZGuiInterface *)0x0)) {
        bVar4 = TPZGuiInterface::AmIKilled(pTVar2->fPointer);
        if (bVar4) break;
      }
      lVar7 = (long)(this->fElementOrder).fStore[lVar8];
      if (-1 < lVar7) {
        ppTVar6 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                            ((TPZChunkVector<TPZCompEl_*,_10> *)pTStack_10508,lVar7);
        pTVar3 = *ppTVar6;
        if (pTVar3 != (TPZCompEl *)0x0) {
          (**(code **)(*(long *)pTVar3 + 0x110))(pTVar3,&TStack_103d0,&local_8200);
          TPZElementMatrix::ComputeDestinationIndices(&TStack_103d0.super_TPZElementMatrix);
          TPZEquationFilter::Filter
                    (pTStack_104e0,
                     &TStack_103d0.super_TPZElementMatrix.fSourceIndex.super_TPZVec<long>,
                     &TStack_103d0.super_TPZElementMatrix.fDestinationIndex.super_TPZVec<long>);
          if (this->f_quiet == 0) {
            if ((lVar9 * -0x3333333333333333 + 0x1999999999999998U >> 2 |
                lVar9 * -0x3333333333333333 << 0x3e) < 0xccccccccccccccd) {
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
              std::ostream::put(-0x58);
              lVar7 = std::ostream::flush();
              std::ostream::_M_insert<long>(lVar7);
            }
            iStack_10514 = CONCAT31(iStack_10514._1_3_,0x2a);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)&iStack_10514,1);
            std::ostream::flush();
          }
          iVar5 = (**(code **)(*(long *)pTVar3 + 0x1f0))(pTVar3);
          if (iVar5 == 0) {
            (*(pTStack_10510->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x34])
                      (pTStack_10510,pTStack_10500,&TStack_103d0.super_TPZElementMatrix.fSourceIndex
                       ,&TStack_103d0.super_TPZElementMatrix.fDestinationIndex);
            rhs_00 = pTStack_104f8;
          }
          else {
            TPZElementMatrixT<std::complex<double>_>::ApplyConstraints(&TStack_103d0);
            TPZElementMatrixT<std::complex<double>_>::ApplyConstraints(&local_8200);
            (*(pTStack_10510->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x34])
                      (pTStack_10510,pTStack_104f0,&TStack_103d0.super_TPZElementMatrix.fSourceIndex
                       ,&TStack_103d0.super_TPZElementMatrix.fDestinationIndex);
            rhs_00 = pTStack_104e8;
          }
          TPZFMatrix<std::complex<double>_>::AddFel
                    (pTStack_104d8,rhs_00,
                     &TStack_103d0.super_TPZElementMatrix.fSourceIndex.super_TPZVec<long>,
                     &TStack_103d0.super_TPZElementMatrix.fDestinationIndex.super_TPZVec<long>);
          lVar9 = lVar9 + 1;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar1 != lVar8);
  }
  if (this->f_quiet == 0) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
  }
  TStack_104d0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (TStack_104d0.fStore != (int *)0x0) {
    operator_delete__(TStack_104d0.fStore);
  }
  TPZManVector<long,_10>::~TPZManVector(&TStack_104b0);
  TPZManVector<long,_10>::~TPZManVector(&TStack_10440);
  local_8200.super_TPZElementMatrix._vptr_TPZElementMatrix =
       (_func_int **)&PTR__TPZElementMatrixT_0194d820;
  TPZBlock::~TPZBlock(&local_8200.fConstrBlock);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix
            (&local_8200.fConstrMat.super_TPZFMatrix<std::complex<double>_>,&PTR_PTR_01887fd8);
  TPZBlock::~TPZBlock(&local_8200.fBlock);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix
            (&local_8200.fMat.super_TPZFMatrix<std::complex<double>_>,&PTR_PTR_01887fd8);
  TPZElementMatrix::~TPZElementMatrix(&local_8200.super_TPZElementMatrix);
  TStack_103d0.super_TPZElementMatrix._vptr_TPZElementMatrix =
       (_func_int **)&PTR__TPZElementMatrixT_0194d820;
  TPZBlock::~TPZBlock(&TStack_103d0.fConstrBlock);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix
            (&TStack_103d0.fConstrMat.super_TPZFMatrix<std::complex<double>_>,&PTR_PTR_01887fd8);
  TPZBlock::~TPZBlock(&TStack_103d0.fBlock);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix
            (&TStack_103d0.fMat.super_TPZFMatrix<std::complex<double>_>,&PTR_PTR_01887fd8);
  TPZElementMatrix::~TPZElementMatrix(&TStack_103d0.super_TPZElementMatrix);
  return;
}

Assistant:

void TPZFrontStructMatrix<TFront,TVar,TPar>::AssembleNew(TPZMatrix<TVar> & stiffness, TPZFMatrix<TVar> & rhs,TPZAutoPointer<TPZGuiInterface> guiInterface){
	
	int64_t iel;
	int64_t numel = 0, nelem = this->fMesh->NElements();
	TPZElementMatrixT<TVar> ek(this->fMesh,TPZElementMatrix::EK),ef(this->fMesh,TPZElementMatrix::EF);
	TPZManVector<int64_t> destinationindex(0);
	TPZManVector<int64_t> sourceindex(0);
	
	TPZAdmChunkVector<TPZCompEl *> &elementvec = this->fMesh->ElementVec();
	
	
	/**Rearange elements order*/
	TPZVec<int> elorder(this->fMesh->NEquations(),0);
	
	OrderElement();
	
	
	for(iel=0; iel < nelem; iel++) {
		
		if(guiInterface) if(guiInterface->AmIKilled()){
			break;
		}
		
		if(fElementOrder[iel] < 0) continue;
		TPZCompEl *el = elementvec[fElementOrder[iel]];
		if(!el) continue;
		//		int dim = el->NumNodes();
		
		//Builds elements stiffness matrix
		el->CalcStiff(ek,ef);
		ek.ComputeDestinationIndices();
		this->FilterEquations(ek.fSourceIndex,ek.fDestinationIndex);
		//ek.fMat->Print(out);
		//ef.fMat->Print();
		if(!f_quiet)
		{
			if(!(numel%20)) cout << endl << numel;
			//    if(!(numel%20)) cout << endl;
			cout << '*';
			cout.flush();
		}
		numel++;
		
		if(!el->HasDependency()) {
			stiffness.AddKel(ek.fMat,ek.fSourceIndex,ek.fDestinationIndex);
			rhs.AddFel(ef.fMat,ek.fSourceIndex, ek.fDestinationIndex);
		}
		else {
			//ek.Print(*this->fMesh,cout);
			ek.ApplyConstraints();
			ef.ApplyConstraints();
			stiffness.AddKel(ek.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
			rhs.AddFel(ef.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
			/*
			 if(ek.fConstrMat->Decompose_LU() != -1) {
			 el->ApplyConstraints(ek,ef);
			 ek.Print(*this,check);
			 check.flush();
			 }
			 */
		}
		
	}//fim for iel
	if(!f_quiet)
	{
		cout << endl;
	}
}